

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O1

void Js::ByteCodeDumper::
     DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
               (OpCode op,OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  FunctionProxy *pFVar8;
  ParseableFunctionInfo *pPVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 *puVar11;
  undefined6 in_register_0000003a;
  char16_t *pcVar12;
  undefined8 uVar10;
  
  iVar6 = (int)CONCAT62(in_register_0000003a,op);
  if (iVar6 < 0x147) {
    if (iVar6 != 0x8c) {
      if (iVar6 == 0xd9) {
LAB_00801a95:
        pFVar8 = ParseableFunctionInfo::GetNestedFunctionProxy
                           (&dumpFunction->super_ParseableFunctionInfo,(uint)data->SlotIndex);
        bVar1 = data->Value;
        bVar2 = data->Instance;
        pPVar9 = FunctionProxy::EnsureDeserialized(pFVar8);
        iVar6 = (*(pPVar9->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject
                  ._vptr_IRecyclerVisitedObject[7])(pPVar9);
        uVar10 = CONCAT44(extraout_var,iVar6);
        pcVar12 = L" R%d = hmo:R%d, %s()";
LAB_00801b17:
        Output::Print(pcVar12,(ulong)bVar1,(ulong)bVar2,uVar10);
        return;
      }
      if (iVar6 != 0x138) goto LAB_00801b36;
    }
LAB_00801a50:
    bVar1 = data->Value;
    bVar2 = data->Instance;
    bVar3 = data->SlotIndex;
    pcVar12 = L" R%d = R%d[%d] ";
  }
  else {
    uVar7 = (ulong)(iVar6 - 0x147U);
    if (iVar6 - 0x147U < 0x3d) {
      if ((0x380000000U >> (uVar7 & 0x3f) & 1) != 0) {
        pFVar8 = ParseableFunctionInfo::GetNestedFunctionProxy
                           (&dumpFunction->super_ParseableFunctionInfo,(uint)data->SlotIndex);
        bVar1 = data->Value;
        bVar2 = data->Instance;
        pPVar9 = FunctionProxy::EnsureDeserialized(pFVar8);
        iVar6 = (*(pPVar9->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject
                  ._vptr_IRecyclerVisitedObject[7])(pPVar9);
        uVar10 = CONCAT44(extraout_var_00,iVar6);
        pcVar12 = L" R%d = env:R%d, %s()";
        goto LAB_00801b17;
      }
      if ((0x1000000000000081U >> (uVar7 & 0x3f) & 1) == 0) {
        if (uVar7 == 0x22) goto LAB_00801a95;
        goto LAB_00801ac3;
      }
    }
    else {
LAB_00801ac3:
      if (1 < iVar6 - 0x1f7U) {
        if (iVar6 != 0x1f6) {
LAB_00801b36:
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                      ,0x36d,"(false)","Unknown OpCode for OpLayoutElementSlot");
          if (bVar5) {
            *puVar11 = 0;
            return;
          }
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        goto LAB_00801a50;
      }
    }
    bVar1 = data->Instance;
    bVar2 = data->SlotIndex;
    bVar3 = data->Value;
    pcVar12 = L" R%d[%d] = R%d ";
  }
  Output::Print(pcVar12,(ulong)bVar1,(ulong)bVar2,(ulong)bVar3);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementSlot(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::NewInnerStackScFunc:
            case OpCode::NewInnerScFunc:
            case OpCode::NewInnerScGenFunc:
            {
                FunctionProxy* pfuncActual = dumpFunction->GetNestedFunctionProxy((uint)data->SlotIndex);
                Output::Print(_u(" R%d = env:R%d, %s()"), data->Value, data->Instance,
                        pfuncActual->EnsureDeserialized()->GetDisplayName());
                break;
            }
            case OpCode::NewScFuncHomeObj:
            case OpCode::NewScGenFuncHomeObj:
            {
                FunctionProxy* pfuncActual = dumpFunction->GetNestedFunctionProxy((uint)data->SlotIndex);
                Output::Print(_u(" R%d = hmo:R%d, %s()"), data->Value, data->Instance,
                    pfuncActual->EnsureDeserialized()->GetDisplayName());
                break;
            }
#if ENABLE_NATIVE_CODEGEN
            case OpCode::StSlot:
            case OpCode::StSlotChkUndecl:
#endif
            case OpCode::StObjSlot:
            case OpCode::StObjSlotChkUndecl:
            case OpCode::StPropIdArrFromVar:
                Output::Print(_u(" R%d[%d] = R%d "),data->Instance,data->SlotIndex,data->Value);
                break;
            case OpCode::LdSlot:
#if ENABLE_NATIVE_CODEGEN
            case OpCode::LdSlotArr:
#endif
            case OpCode::LdObjSlot:
                Output::Print(_u(" R%d = R%d[%d] "),data->Value,data->Instance,data->SlotIndex);
                break;
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementSlot");
                break;
            }
        }
    }